

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.h
# Opt level: O0

int CVmObject::get_prop_check_argc(vm_val_t *val,uint *argc,CVmNativeCodeDesc *desc)

{
  int iVar1;
  CVmNativeCodeDesc *in_RDX;
  int *in_RSI;
  vm_val_t *in_RDI;
  undefined4 local_4;
  
  if (in_RSI == (int *)0x0) {
    vm_val_t::set_native(in_RDI,in_RDX);
    local_4 = 1;
  }
  else {
    iVar1 = CVmNativeCodeDesc::args_ok(in_RDX,*in_RSI);
    if (iVar1 == 0) {
      err_throw(0);
    }
    *in_RSI = 0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int get_prop_check_argc(vm_val_t *val, uint *argc,
                                   const CVmNativeCodeDesc *desc)
    {
        /* 
         *   if there's no 'argc', we can't execute the native code - we're
         *   simply being asked for a description of the method, not to
         *   evaluate its result 
         */
        if (argc == 0)
        {
            /* indicate a native code evaluation is required */
            val->set_native(desc);

            /* tell get_prop() to return without further work */
            return TRUE;
        }

        /* check the argument count - throw an error if out of range */
        if (!desc->args_ok(*argc))
            err_throw(VMERR_WRONG_NUM_OF_ARGS);

        /* everything's fine - consume the arguments */
        *argc = 0;

        /* tell get_prop() to proceed with the native evaluation */
        return FALSE;
    }